

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testModule.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  int iVar3;
  hello_world_t hello_world;
  xmlChar filename [4096];
  code *local_1020;
  undefined1 local_1018 [4104];
  
  local_1020 = (code *)0x0;
  iVar3 = 0;
  xmlStrPrintf(local_1018,0x1000,"%s/testdso%s",".libs",".so");
  lVar2 = xmlModuleOpen(local_1018,0);
  if (lVar2 == 0) {
LAB_00101258:
    xmlMemoryDump();
  }
  else {
    iVar1 = xmlModuleSymbol(lVar2,"hello_world",&local_1020);
    if (iVar1 == 0) {
      if (local_1020 != (code *)0x0) {
        (*local_1020)();
        xmlModuleClose(lVar2);
        goto LAB_00101258;
      }
      main_cold_2();
    }
    else {
      main_cold_1();
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    xmlChar filename[PATH_MAX];
    xmlModulePtr module = NULL;
    hello_world_t hello_world = NULL;

    /* build the module filename, and confirm the module exists */
    xmlStrPrintf(filename, sizeof(filename),
                 "%s/testdso%s",
                 (const xmlChar*)MODULE_PATH,
		 (const xmlChar*)LIBXML_MODULE_EXTENSION);

    module = xmlModuleOpen((const char*)filename, 0);
    if (module)
      {
        if (xmlModuleSymbol(module, "hello_world", (void **) &hello_world)) {
	    fprintf(stderr, "Failure to lookup\n");
	    return(1);
	}
	if (hello_world == NULL) {
	    fprintf(stderr, "Lookup returned NULL\n");
	    return(1);
	}

        (*hello_world)();

        xmlModuleClose(module);
      }

    xmlMemoryDump();

    return(0);
}